

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_retrieveDuplicateIdItemLists_Test::TestBody
          (Annotator_retrieveDuplicateIdItemLists_Test *this)

{
  _Storage *p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar2;
  pointer ppVar3;
  code *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _func_void__Op_any_ptr__Arg_ptr *p_Var10;
  char cVar11;
  undefined4 uVar12;
  int iVar13;
  mapped_type *pmVar14;
  void *pvVar15;
  undefined8 *puVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_11;
  key_type *__k;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar17;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  *this_00;
  char *pcVar18;
  pointer this_01;
  pointer this_02;
  _func_void__Op_any_ptr__Arg_ptr *p_Var19;
  long lVar20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_00;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_01;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_02;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  __l_04;
  ModelPtr model;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  VariablePtr c4v2;
  VariablePtr c2v2;
  VariablePtr c2v1;
  VariablePtr c3v1;
  VariablePtr c4v1;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  items;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  expectedItems;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  AnnotatorPtr annotator;
  ParserPtr parser;
  undefined8 local_9c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9c0;
  pair<libcellml::CellmlElementType,_std::any> local_9b8;
  undefined4 local_9a0;
  code *local_998;
  undefined8 *local_990;
  undefined4 local_988;
  code *local_980;
  undefined8 *local_978;
  undefined4 local_970;
  code *local_968;
  undefined8 *local_960;
  undefined4 local_958;
  code *local_950;
  undefined8 *local_948;
  undefined4 local_940;
  code *local_938;
  undefined8 *local_930;
  undefined4 local_928;
  code *local_920;
  undefined8 *local_918;
  undefined4 local_910;
  code *local_908;
  undefined8 *local_900;
  undefined1 local_8f8 [32];
  pointer local_8d8;
  undefined1 local_8c8 [16];
  undefined1 *local_8b8 [2];
  undefined1 local_8a8 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *local_898 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_888;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_850;
  allocator_type local_816;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_815;
  allocator_type local_814;
  allocator_type local_813;
  allocator_type local_812;
  allocator_type local_811;
  pair<libcellml::CellmlElementType,_std::any> local_810;
  undefined4 local_7f8;
  code *local_7f0;
  undefined8 *local_7e8;
  undefined4 local_7e0;
  code *local_7d8;
  undefined8 *local_7d0;
  undefined4 local_7c8;
  code *local_7c0;
  undefined8 *local_7b8;
  undefined4 local_7b0;
  code *local_7a8;
  undefined8 *local_7a0;
  undefined4 local_798;
  code *local_790;
  undefined8 *local_788;
  undefined4 local_780;
  code *local_778;
  undefined8 *local_770;
  shared_ptr<libcellml::Units> local_768;
  long local_758 [2];
  long *local_748;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_740;
  long local_738 [2];
  undefined8 local_728;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_720;
  undefined8 local_718;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_710;
  undefined8 local_708;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_700;
  undefined8 local_6f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6f0;
  undefined8 local_6e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6e0;
  undefined8 local_6d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6d0;
  undefined8 local_6c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6c0;
  undefined8 local_6b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6b0;
  undefined8 local_6a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6a0;
  undefined8 local_698;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_690;
  undefined8 local_688;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_680;
  undefined8 local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_670;
  undefined8 local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_660;
  undefined8 local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_650;
  undefined8 local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_640;
  undefined8 local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_630;
  undefined8 local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_620;
  undefined8 local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_610;
  undefined8 local_608;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_600;
  undefined8 local_5f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5f0;
  undefined8 local_5e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5d8;
  pair<libcellml::CellmlElementType,_std::any> local_5d0;
  undefined4 local_5b8;
  code *local_5b0;
  undefined8 *local_5a8;
  undefined4 local_5a0;
  code *local_598;
  undefined8 *local_590;
  undefined4 local_588;
  code *local_580;
  undefined8 *local_578;
  undefined4 local_570;
  code *local_568;
  undefined8 *local_560;
  undefined4 local_558;
  code *local_550;
  undefined8 *local_548;
  undefined4 local_540;
  code *local_538;
  undefined8 *local_530;
  undefined4 local_528;
  code *local_520;
  undefined8 *local_518;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  local_510;
  long *local_4e0 [2];
  long local_4d0 [2];
  long *local_4c0 [2];
  long local_4b0 [2];
  long *local_4a0 [2];
  long local_490 [2];
  long *local_480 [2];
  long local_470 [2];
  long *local_460 [2];
  long local_450 [2];
  long *local_440 [2];
  long local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  long *local_400 [2];
  long local_3f0 [2];
  long *local_3e0 [2];
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0 [2];
  long local_2b0 [2];
  key_type *local_2a0;
  string local_298 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  string local_288 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  string local_278 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  string local_268 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  string local_258 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  string local_248 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  string local_238 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  string local_228 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  string local_218 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  string local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  long *local_1e0 [2];
  long local_1d0 [2];
  pair<libcellml::CellmlElementType,_std::any> local_1c0;
  undefined4 local_1a8;
  code *local_1a0;
  undefined8 *local_198;
  undefined4 local_190;
  code *local_188;
  undefined8 *local_180;
  undefined4 local_178;
  code *local_170;
  undefined8 *local_168;
  undefined4 local_160;
  code *local_158;
  undefined8 *local_150;
  undefined4 local_148;
  code *local_140;
  undefined8 *local_138;
  undefined4 local_130;
  code *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  undefined8 local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  undefined1 local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_90;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_78;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_60;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_48;
  
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"duplicateId1","");
  local_8d8 = (pointer)local_8c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"duplicateId2","");
  local_8b8[0] = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"duplicateId3","");
  ppVar17 = &local_888;
  local_898[0] = ppVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"duplicateId4","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_8f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,__l,(allocator_type *)&local_9b8);
  lVar20 = -0x80;
  do {
    ppVar2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)ppVar17[-1].second.
                super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar17 != ppVar2) {
      operator_delete(ppVar2,(ulong)((ppVar17->first)._M_dataplus._M_p + 1));
    }
    ppVar17 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
               *)((long)&ppVar17[-1].first.field_2 + 8);
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0);
  libcellml::Parser::create(SUB81(local_a0,0));
  libcellml::Parser::parseModel((string *)&local_9c8);
  uVar7 = local_9c8;
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"component2","");
  libcellml::ComponentEntity::component((string *)&local_5d0,SUB81(uVar7,0));
  local_9b8._0_8_ = &local_9b8.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"variable1","");
  libcellml::Component::variable((string *)&local_708);
  if ((_Storage *)local_9b8._0_8_ != &local_9b8.second._M_storage) {
    operator_delete((void *)local_9b8._0_8_,(long)local_9b8.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
  }
  uVar7 = local_9c8;
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"component2","");
  libcellml::ComponentEntity::component((string *)&local_5d0,SUB81(uVar7,0));
  local_9b8._0_8_ = &local_9b8.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"variable2","");
  libcellml::Component::variable((string *)&local_718);
  if ((_Storage *)local_9b8._0_8_ != &local_9b8.second._M_storage) {
    operator_delete((void *)local_9b8._0_8_,(long)local_9b8.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
  }
  uVar7 = local_9c8;
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"component2","");
  libcellml::ComponentEntity::component((string *)&local_810,SUB81(uVar7,0));
  uVar7 = local_810._0_8_;
  local_9b8._0_8_ = &local_9b8.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"component3","");
  libcellml::ComponentEntity::component((string *)&local_1c0,SUB81(uVar7,0));
  p_Var1 = &local_5d0.second._M_storage;
  local_5d0._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"variable1","");
  libcellml::Component::variable((string *)&local_6f8);
  if ((_Storage *)local_5d0._0_8_ != p_Var1) {
    operator_delete((void *)local_5d0._0_8_,(long)local_5d0.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.second._M_manager);
  }
  if ((_Storage *)local_9b8._0_8_ != &local_9b8.second._M_storage) {
    operator_delete((void *)local_9b8._0_8_,(long)local_9b8.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
  }
  uVar7 = local_9c8;
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"component4","");
  libcellml::ComponentEntity::component((string *)&local_5d0,SUB81(uVar7,0));
  local_9b8._0_8_ = &local_9b8.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"variable1","");
  libcellml::Component::variable((string *)&local_5e0);
  if ((_Storage *)local_9b8._0_8_ != &local_9b8.second._M_storage) {
    operator_delete((void *)local_9b8._0_8_,(long)local_9b8.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
  }
  uVar7 = local_9c8;
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"component4","");
  libcellml::ComponentEntity::component((string *)&local_5d0,SUB81(uVar7,0));
  local_9b8._0_8_ = &local_9b8.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"variable2","");
  libcellml::Component::variable((string *)&local_728);
  if ((_Storage *)local_9b8._0_8_ != &local_9b8.second._M_storage) {
    operator_delete((void *)local_9b8._0_8_,(long)local_9b8.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d0.second._M_manager);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
  }
  local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"units2","");
  libcellml::Model::units((string *)&local_5f8);
  p_Var5 = p_Stack_5f0;
  uVar8 = local_5f8;
  local_5f8 = 0;
  p_Stack_5f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9b8.first = 0xd;
  local_9b8.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_9b8.second._M_storage._M_ptr = (void *)0x0;
  local_9b8.second._M_storage._M_ptr = operator_new(0x10);
  uVar7 = local_9c8;
  *(undefined8 *)local_9b8.second._M_storage._M_ptr = uVar8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_9b8.second._M_storage._M_ptr + 8) =
       p_Var5;
  local_748 = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"component1","");
  libcellml::ComponentEntity::component(local_208,SUB81(uVar7,0));
  libcellml::ImportedEntity::importSource();
  p_Var5 = p_Stack_600;
  uVar7 = local_608;
  local_608 = 0;
  p_Stack_600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9a0 = 4;
  local_998 = std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_990 = (undefined8 *)0x0;
  local_990 = (undefined8 *)operator_new(0x10);
  *local_990 = uVar7;
  local_990[1] = p_Var5;
  libcellml::VariablePair::create((shared_ptr *)&local_b8,(shared_ptr *)&local_5e0);
  p_Var5 = p_Stack_b0;
  uVar8 = local_b8;
  local_b8 = 0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_988 = 5;
  local_980 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_978 = (undefined8 *)0x0;
  local_978 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9c8;
  *local_978 = uVar8;
  local_978[1] = p_Var5;
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"component2","");
  libcellml::ComponentEntity::component((string *)&local_618,SUB81(uVar7,0));
  p_Var5 = p_Stack_610;
  uVar7 = local_618;
  local_618 = 0;
  p_Stack_610 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_970 = 0;
  local_968 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_960 = (undefined8 *)0x0;
  local_960 = (undefined8 *)operator_new(0x10);
  *local_960 = uVar7;
  local_960[1] = p_Var5;
  libcellml::VariablePair::create((shared_ptr *)&local_c8,(shared_ptr *)&local_708);
  p_Var5 = p_Stack_c0;
  uVar8 = local_c8;
  local_c8 = 0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_958 = 2;
  local_950 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_948 = (undefined8 *)0x0;
  local_948 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9c8;
  *local_948 = uVar8;
  local_948[1] = p_Var5;
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"component2","");
  libcellml::ComponentEntity::component(local_218,SUB81(uVar7,0));
  libcellml::Component::reset((ulong)&local_628);
  p_Var5 = p_Stack_620;
  uVar8 = local_628;
  local_628 = 0;
  p_Stack_620 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_940 = 10;
  local_938 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_930 = (undefined8 *)0x0;
  local_930 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9c8;
  *local_930 = uVar8;
  local_930[1] = p_Var5;
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"component2","");
  libcellml::ComponentEntity::component(local_228,SUB81(uVar7,0));
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"component3","");
  libcellml::ComponentEntity::component((string *)&local_638,(bool)local_228[0]);
  p_Var5 = p_Stack_630;
  uVar8 = local_638;
  local_638 = 0;
  p_Stack_630 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_928 = 1;
  local_920 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_918 = (undefined8 *)0x0;
  local_918 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9c8;
  *local_918 = uVar8;
  local_918[1] = p_Var5;
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"component2","");
  libcellml::ComponentEntity::component(local_248,SUB81(uVar7,0));
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"component3","");
  libcellml::ComponentEntity::component(local_238,(bool)local_248[0]);
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"variable2","");
  libcellml::Component::variable((string *)&local_648);
  p_Var5 = p_Stack_640;
  uVar7 = local_648;
  local_648 = 0;
  p_Stack_640 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_910 = 0xe;
  local_908 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_900 = (undefined8 *)0x0;
  local_900 = (undefined8 *)operator_new(0x10);
  *local_900 = uVar7;
  local_900[1] = p_Var5;
  __l_00._M_len = 8;
  __l_00._M_array = &local_9b8;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_48,__l_00,&local_811);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)local_8f8,(char (*) [13])"duplicateId1",&local_48);
  p_Var5 = local_9c0;
  uVar7 = local_9c8;
  if (local_9c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_9c0 + 8) = *(int *)(local_9c0 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_9c0 + 8) = *(int *)(local_9c0 + 8) + 1;
    }
  }
  local_5d0.first = 7;
  local_5d0.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_5d0.second._M_storage._M_ptr = (void *)0x0;
  local_5d0.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_5d0.second._M_storage._M_ptr = uVar7;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_5d0.second._M_storage._M_ptr + 8) =
       p_Var5;
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"units1","");
  libcellml::Model::units((string *)&local_658);
  p_Var5 = p_Stack_650;
  uVar7 = local_658;
  local_658 = 0;
  p_Stack_650 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5b8 = 0xd;
  local_5b0 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_5a8 = (undefined8 *)0x0;
  local_5a8 = (undefined8 *)operator_new(0x10);
  *local_5a8 = uVar7;
  local_5a8[1] = p_Var5;
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"blob","");
  libcellml::Model::units((string *)&local_668);
  p_Var5 = p_Stack_660;
  uVar7 = local_668;
  local_668 = 0;
  p_Stack_660 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5a0 = 0xd;
  local_598 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_590 = (undefined8 *)0x0;
  local_590 = (undefined8 *)operator_new(0x10);
  *local_590 = uVar7;
  local_590[1] = p_Var5;
  libcellml::VariablePair::create((shared_ptr *)&local_d8,(shared_ptr *)&local_728);
  p_Var9 = p_Stack_d0;
  uVar7 = local_d8;
  local_d8 = 0;
  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_588 = 2;
  local_580 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_578 = (undefined8 *)0x0;
  local_578 = (undefined8 *)operator_new(0x10);
  p_Var5 = local_720;
  *local_578 = uVar7;
  local_578[1] = p_Var9;
  if (local_720 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_720 + 8) = *(int *)(local_720 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_720 + 8) = *(int *)(local_720 + 8) + 1;
    }
  }
  local_570 = 0xe;
  local_568 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_560 = (undefined8 *)0x0;
  local_560 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9c8;
  *local_560 = local_728;
  local_560[1] = p_Var5;
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"component2","");
  libcellml::ComponentEntity::component((string *)&local_678,SUB81(uVar7,0));
  p_Var5 = p_Stack_670;
  uVar8 = local_678;
  local_678 = 0;
  p_Stack_670 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_558 = 1;
  local_550 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_548 = (undefined8 *)0x0;
  local_548 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9c8;
  *local_548 = uVar8;
  local_548[1] = p_Var5;
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"component2","");
  libcellml::ComponentEntity::component(local_258,SUB81(uVar7,0));
  libcellml::Component::reset((ulong)&local_688);
  p_Var9 = p_Stack_680;
  uVar7 = local_688;
  local_688 = 0;
  p_Stack_680 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_540 = 8;
  local_538 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_530 = (undefined8 *)0x0;
  local_530 = (undefined8 *)operator_new(0x10);
  p_Var5 = local_6f0;
  *local_530 = uVar7;
  local_530[1] = p_Var9;
  if (local_6f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_6f0 + 8) = *(int *)(local_6f0 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_6f0 + 8) = *(int *)(local_6f0 + 8) + 1;
    }
  }
  local_528 = 0xe;
  local_520 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_518 = (undefined8 *)0x0;
  local_518 = (undefined8 *)operator_new(0x10);
  *local_518 = local_6f8;
  local_518[1] = p_Var5;
  __l_01._M_len = 8;
  __l_01._M_array = &local_5d0;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_60,__l_01,&local_812);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)(local_8c8 + 8),(char (*) [13])"duplicateId2",&local_60);
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"units1","");
  libcellml::Model::units(local_268);
  libcellml::ImportedEntity::importSource();
  p_Var5 = p_Stack_690;
  uVar7 = local_698;
  local_698 = 0;
  p_Stack_690 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c0.first = IMPORT;
  local_1c0.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_1c0.second._M_storage._M_ptr = (void *)0x0;
  local_1c0.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_1c0.second._M_storage._M_ptr = uVar7;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_1c0.second._M_storage._M_ptr + 8) =
       p_Var5;
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"units3","");
  libcellml::Model::units((string *)&local_6a8);
  p_Var5 = p_Stack_6a0;
  uVar7 = local_6a8;
  local_6a8 = 0;
  p_Stack_6a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1a8 = 0xd;
  local_1a0 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_198 = (undefined8 *)0x0;
  local_198 = (undefined8 *)operator_new(0x10);
  p_Var9 = local_5d8;
  *local_198 = uVar7;
  local_198[1] = p_Var5;
  if (local_5d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_5d8 + 8) = *(int *)(local_5d8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_5d8 + 8) = *(int *)(local_5d8 + 8) + 1;
    }
  }
  local_190 = 0xe;
  local_188 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_180 = (undefined8 *)0x0;
  local_180 = (undefined8 *)operator_new(0x10);
  p_Var5 = local_710;
  *local_180 = local_5e0;
  local_180[1] = p_Var9;
  if (local_710 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_710 + 8) = *(int *)(local_710 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_710 + 8) = *(int *)(local_710 + 8) + 1;
    }
  }
  local_178 = 0xe;
  local_170 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_168 = (undefined8 *)0x0;
  local_168 = (undefined8 *)operator_new(0x10);
  *local_168 = local_718;
  local_168[1] = p_Var5;
  libcellml::VariablePair::create((shared_ptr *)&local_e8,(shared_ptr *)&local_718);
  p_Var5 = p_Stack_e0;
  uVar8 = local_e8;
  local_e8 = 0;
  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_160 = 5;
  local_158 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_150 = (undefined8 *)0x0;
  local_150 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9c8;
  *local_150 = uVar8;
  local_150[1] = p_Var5;
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"component2","");
  libcellml::ComponentEntity::component(local_278,SUB81(uVar7,0));
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"component3","");
  libcellml::ComponentEntity::component((string *)&local_6b8,(bool)local_278[0]);
  p_Var9 = p_Stack_6b0;
  uVar8 = local_6b8;
  local_6b8 = 0;
  p_Stack_6b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148 = 0;
  local_140 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_138 = (undefined8 *)0x0;
  local_138 = (undefined8 *)operator_new(0x10);
  p_Var5 = local_9c0;
  uVar7 = local_9c8;
  *local_138 = uVar8;
  local_138[1] = p_Var9;
  if (local_9c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_9c0 + 8) = *(int *)(local_9c0 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_9c0 + 8) = *(int *)(local_9c0 + 8) + 1;
    }
  }
  local_130 = 3;
  local_128 = std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_120 = (undefined8 *)0x0;
  local_120 = (undefined8 *)operator_new(0x10);
  *local_120 = uVar7;
  local_120[1] = p_Var5;
  __l_02._M_len = 7;
  __l_02._M_array = &local_1c0;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_78,__l_02,&local_813);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_888,(char (*) [13])"duplicateId3",&local_78);
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"units2","");
  libcellml::Model::units(local_288);
  libcellml::UnitsItem::create((shared_ptr *)&local_f8,(ulong)local_288);
  p_Var5 = p_Stack_f0;
  uVar7 = local_f8;
  local_f8 = 0;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_810.first = 0xc;
  local_810.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::UnitsItem>_>::_S_manage;
  local_810.second._M_storage._M_ptr = (void *)0x0;
  local_810.second._M_storage._M_ptr = operator_new(0x10);
  sVar6 = local_9c8._0_1_;
  *(undefined8 *)local_810.second._M_storage._M_ptr = uVar7;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_810.second._M_storage._M_ptr + 8) =
       p_Var5;
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"component1","");
  libcellml::ComponentEntity::component((string *)&local_6c8,(bool)sVar6);
  p_Var5 = p_Stack_6c0;
  uVar7 = local_6c8;
  local_6c8 = 0;
  p_Stack_6c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7f8 = 0;
  local_7f0 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_7e8 = (undefined8 *)0x0;
  local_7e8 = (undefined8 *)operator_new(0x10);
  sVar6 = local_9c8._0_1_;
  *local_7e8 = uVar7;
  local_7e8[1] = p_Var5;
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"component4","");
  libcellml::ComponentEntity::component((string *)&local_6d8,(bool)sVar6);
  p_Var5 = p_Stack_6d0;
  uVar7 = local_6d8;
  local_6d8 = 0;
  p_Stack_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7e0 = 0;
  local_7d8 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_7d0 = (undefined8 *)0x0;
  local_7d0 = (undefined8 *)operator_new(0x10);
  *local_7d0 = uVar7;
  local_7d0[1] = p_Var5;
  libcellml::VariablePair::create((shared_ptr *)&local_108,(shared_ptr *)&local_708);
  p_Var9 = p_Stack_100;
  uVar7 = local_108;
  local_108 = 0;
  p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7c8 = 5;
  local_7c0 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_7b8 = (undefined8 *)0x0;
  local_7b8 = (undefined8 *)operator_new(0x10);
  p_Var5 = local_700;
  *local_7b8 = uVar7;
  local_7b8[1] = p_Var9;
  if (local_700 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_700 + 8) = *(int *)(local_700 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_700 + 8) = *(int *)(local_700 + 8) + 1;
    }
  }
  local_7b0 = 0xe;
  local_7a8 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_7a0 = (undefined8 *)0x0;
  local_7a0 = (undefined8 *)operator_new(0x10);
  *local_7a0 = local_708;
  local_7a0[1] = p_Var5;
  libcellml::VariablePair::create((shared_ptr *)&local_118,(shared_ptr *)&local_718);
  p_Var5 = p_Stack_110;
  uVar7 = local_118;
  local_118 = 0;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_798 = 5;
  local_790 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_788 = (undefined8 *)0x0;
  local_788 = (undefined8 *)operator_new(0x10);
  *local_788 = uVar7;
  local_788[1] = p_Var5;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"component2","");
  libcellml::ComponentEntity::component(local_298,(bool)local_9c8._0_1_);
  libcellml::Component::reset((ulong)&local_6e8);
  p_Var5 = p_Stack_6e0;
  uVar7 = local_6e8;
  local_6e8 = 0;
  p_Stack_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_780 = 9;
  local_778 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_770 = (undefined8 *)0x0;
  local_770 = (undefined8 *)operator_new(0x10);
  *local_770 = uVar7;
  local_770[1] = p_Var5;
  __l_03._M_len = 7;
  __l_03._M_array = &local_810;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_90,__l_03,&local_814);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_850,(char (*) [13])"duplicateId4",&local_90);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_8f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
         *)&local_510,__l_04,&local_815,&local_816);
  lVar20 = -0xe0;
  this_00 = &local_850.second;
  do {
    std::
    vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
    ::~vector(this_00);
    ppVar3 = this_00[-2].
             super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((pointer)((long)(this_00 + -1) + 8) != ppVar3) {
      operator_delete(ppVar3,(ulong)((long)&((pointer)
                                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)((long)(this_00 + -1) + 8))->_M_allocated_capacity)
                                            ->first + 1));
    }
    this_00 = (vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
               *)&this_00[-3].
                  super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar20 = lVar20 + 0x38;
  } while (lVar20 != 0);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_90);
  lVar20 = 0x98;
  do {
    pcVar4 = *(code **)((long)&local_810.first + lVar20);
    if (pcVar4 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_810.first + lVar20);
      (*pcVar4)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_6e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6e0);
  }
  if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  if (p_Stack_6d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6d0);
  }
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  if (p_Stack_6c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6c0);
  }
  if (local_4c0[0] != local_4b0) {
    operator_delete(local_4c0[0],local_4b0[0] + 1);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
  }
  if (local_4a0[0] != local_490) {
    operator_delete(local_4a0[0],local_490[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_78);
  lVar20 = 0x98;
  do {
    pcVar4 = *(code **)((long)&local_1c0.first + lVar20);
    if (pcVar4 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_1c0.first + lVar20);
      (*pcVar4)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_6b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6b0);
  }
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
  }
  if (local_460[0] != local_450) {
    operator_delete(local_460[0],local_450[0] + 1);
  }
  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
  }
  if (p_Stack_6a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6a0);
  }
  if (local_440[0] != local_430) {
    operator_delete(local_440[0],local_430[0] + 1);
  }
  if (p_Stack_690 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_690);
  }
  if (local_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260);
  }
  if (local_420[0] != local_410) {
    operator_delete(local_420[0],local_410[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_60);
  lVar20 = 0xb0;
  do {
    pcVar4 = *(code **)((long)&local_5d0.first + lVar20);
    if (pcVar4 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_5d0.first + lVar20);
      (*pcVar4)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_680 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_680);
  }
  if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
  }
  if (local_400[0] != local_3f0) {
    operator_delete(local_400[0],local_3f0[0] + 1);
  }
  if (p_Stack_670 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_670);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
  }
  if (p_Stack_660 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_660);
  }
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  if (p_Stack_650 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_650);
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_48);
  lVar20 = 0xb0;
  do {
    pcVar4 = *(code **)((long)&local_9b8.first + lVar20);
    if (pcVar4 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_9b8.first + lVar20);
      (*pcVar4)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_640);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
  }
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  if (p_Stack_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_630);
  }
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
  }
  if (local_300[0] != local_2f0) {
    operator_delete(local_300[0],local_2f0[0] + 1);
  }
  if (p_Stack_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_620);
  }
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
  }
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0],local_2d0[0] + 1);
  }
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  if (p_Stack_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_610);
  }
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0],local_2b0[0] + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if (p_Stack_600 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_600);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if (local_748 != local_738) {
    operator_delete(local_748,local_738[0] + 1);
  }
  if (p_Stack_5f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5f0);
  }
  if (local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_758) {
    operator_delete(local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_758[0] + 1);
  }
  libcellml::Annotator::create();
  libcellml::Annotator::setModel((shared_ptr *)CONCAT44(local_1c0._4_4_,local_1c0.first));
  libcellml::Annotator::duplicateIds_abi_cxx11_();
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&local_9b8,"ids","annotator->duplicateIds()",&local_1f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_8f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8f8);
  if ((undefined1)local_9b8.first == COMPONENT) {
    testing::Message::Message((Message *)local_8f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_9b8.second._M_manager;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x721,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5d0,(Message *)local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5d0);
    if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
        (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
       ((long *)local_8f8._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_8f8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_9b8.second,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a0 = local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = (pointer)0x0;
  __k = local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      libcellml::Annotator::items((string *)&local_5d0);
      p_Var10 = local_5d0.second._M_manager;
      if ((_func_void__Op_any_ptr__Arg_ptr *)local_5d0._0_8_ != local_5d0.second._M_manager) {
        lVar20 = 8;
        this_02 = this_01;
        p_Var19 = (_func_void__Op_any_ptr__Arg_ptr *)local_5d0._0_8_;
        do {
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                  *)&local_510,__k);
          ppVar3 = (pmVar14->
                   super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar12 = libcellml::AnyCellmlElement::type();
          local_9b8.first = uVar12;
          testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
                    ((internal *)local_8f8,"expectedItems[id][index].first","item->type()",
                     (CellmlElementType *)((long)ppVar3 + lVar20 + -8),&local_9b8.first);
          if (local_8f8[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_9b8);
            pcVar18 = "";
            if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
              pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_810,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                       ,0x728,pcVar18);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_810,(Message *)&local_9b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
            if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
               ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
              (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_8f8 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar12 = libcellml::AnyCellmlElement::type();
          this_01 = this_02;
          switch(uVar12) {
          case 0:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",(shared_ptr<libcellml::Component> *)&local_9b8,
                       (shared_ptr<libcellml::Component> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x72b,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 1:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",(shared_ptr<libcellml::Component> *)&local_9b8,
                       (shared_ptr<libcellml::Component> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x72e,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 2:
            libcellml::AnyCellmlElement::variablePair();
            this_01 = (pointer)local_8f8._8_8_;
            local_8f8._0_8_ = (long *)0x0;
            local_8f8._8_8_ = (pointer)0x0;
            if ((this_02 != (pointer)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02),
               (pointer)local_8f8._8_8_ != (pointer)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8._8_8_);
            }
            libcellml::VariablePair::variable1();
            libcellml::NamedEntity::name_abi_cxx11_();
            iVar13 = std::__cxx11::string::compare(local_8f8);
            if (iVar13 == 0) {
              local_810.first._0_1_ = 1;
              local_810.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            }
            else {
              libcellml::VariablePair::variable1();
              libcellml::NamedEntity::name_abi_cxx11_();
              iVar13 = std::__cxx11::string::compare((char *)&local_9b8);
              local_810.first._0_1_ = iVar13 == 0;
              local_810.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
              if ((_Storage *)local_9b8._0_8_ != &local_9b8.second._M_storage) {
                operator_delete((void *)local_9b8._0_8_,(long)local_9b8.second._M_storage._M_ptr + 1
                               );
              }
              if (local_740 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_740);
              }
            }
            if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
              operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
            }
            if (local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((undefined1)local_810.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_8f8,(char *)&local_810,
                         "\"variable1\" == testPair->variable1()->name() || \"variable2\" == testPair->variable1()->name()"
                         ,"false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_768,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x733,(char *)local_8f8._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_768,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_768);
              if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
              }
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_810.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            libcellml::VariablePair::variable2();
            libcellml::NamedEntity::name_abi_cxx11_();
            iVar13 = std::__cxx11::string::compare(local_8f8);
            if (iVar13 == 0) {
              local_810.first._0_1_ = 1;
              local_810.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            }
            else {
              libcellml::VariablePair::variable2();
              libcellml::NamedEntity::name_abi_cxx11_();
              iVar13 = std::__cxx11::string::compare((char *)&local_9b8);
              local_810.first._0_1_ = iVar13 == 0;
              local_810.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
              if ((_Storage *)local_9b8._0_8_ != &local_9b8.second._M_storage) {
                operator_delete((void *)local_9b8._0_8_,(long)local_9b8.second._M_storage._M_ptr + 1
                               );
              }
              if (local_740 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_740);
              }
            }
            if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
              operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
            }
            if (local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((undefined1)local_810.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_8f8,(char *)&local_810,
                         "\"variable1\" == testPair->variable2()->name() || \"variable2\" == testPair->variable2()->name()"
                         ,"false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_768,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x734,(char *)local_8f8._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_768,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_768);
              if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
              }
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_810.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 3:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9b8,
                       (shared_ptr<libcellml::Model> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x737,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 4:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::ImportSource>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::importSource();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second)",
                       "item->importSource()",(shared_ptr<libcellml::ImportSource> *)&local_9b8,
                       (shared_ptr<libcellml::ImportSource> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x73a,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 5:
            libcellml::AnyCellmlElement::variablePair();
            this_01 = (pointer)local_8f8._8_8_;
            local_8f8._0_8_ = (long *)0x0;
            local_8f8._8_8_ = (pointer)0x0;
            if ((this_02 != (pointer)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02),
               (pointer)local_8f8._8_8_ != (pointer)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8._8_8_);
            }
            iVar13 = std::__cxx11::string::compare((char *)__k);
            if (iVar13 == 0) {
              libcellml::VariablePair::variable1();
              libcellml::NamedEntity::name_abi_cxx11_();
              testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                        ((internal *)&local_9b8,"\"variable1\"","testPair->variable1()->name()",
                         (char (*) [10])"variable1",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8f8);
              if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_810.second._M_manager);
              }
              if ((undefined1)local_9b8.first == COMPONENT) {
                testing::Message::Message((Message *)local_8f8);
                pcVar18 = "";
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pcVar18 = *(char **)local_9b8.second._M_manager;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_810,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                           ,0x73f,pcVar18);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_810,(Message *)local_8f8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                    (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                   ((long *)local_8f8._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_9b8.second,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              libcellml::VariablePair::variable2();
              libcellml::NamedEntity::name_abi_cxx11_();
              testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                        ((internal *)&local_9b8,"\"variable1\"","testPair->variable2()->name()",
                         (char (*) [10])"variable1",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8f8);
              if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_810.second._M_manager);
              }
              if ((undefined1)local_9b8.first == COMPONENT) {
                testing::Message::Message((Message *)local_8f8);
                pcVar18 = "";
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pcVar18 = *(char **)local_9b8.second._M_manager;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_810,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                           ,0x740,pcVar18);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_810,(Message *)local_8f8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                    (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                   ((long *)local_8f8._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_9b8.second,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              iVar13 = std::__cxx11::string::compare((char *)__k);
              if (iVar13 == 0) {
                libcellml::VariablePair::variable1();
                libcellml::NamedEntity::name_abi_cxx11_();
                testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                          ((internal *)&local_9b8,"\"variable2\"","testPair->variable1()->name()",
                           (char (*) [10])"variable2",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8f8);
                if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                  operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_810.second._M_manager);
                }
                if ((undefined1)local_9b8.first == COMPONENT) {
                  testing::Message::Message((Message *)local_8f8);
                  pcVar18 = "";
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pcVar18 = *(char **)local_9b8.second._M_manager;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_810,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                             ,0x742,pcVar18);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_810,(Message *)local_8f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                  if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                      (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                     ((long *)local_8f8._0_8_ != (long *)0x0)) {
                    (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_9b8.second,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                libcellml::VariablePair::variable2();
                libcellml::NamedEntity::name_abi_cxx11_();
                testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                          ((internal *)&local_9b8,"\"variable2\"","testPair->variable2()->name()",
                           (char (*) [10])"variable2",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8f8);
                if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                  operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_810.second._M_manager);
                }
                if ((undefined1)local_9b8.first == COMPONENT) {
                  testing::Message::Message((Message *)local_8f8);
                  pcVar18 = "";
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pcVar18 = *(char **)local_9b8.second._M_manager;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_810,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                             ,0x743,pcVar18);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_810,(Message *)local_8f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                  if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                      (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                     ((long *)local_8f8._0_8_ != (long *)0x0)) {
                    (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_9b8.second,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                iVar13 = std::__cxx11::string::compare((char *)__k);
                if (iVar13 == 0) {
                  libcellml::VariablePair::variable1();
                  libcellml::NamedEntity::name_abi_cxx11_();
                  iVar13 = std::__cxx11::string::compare(local_8f8);
                  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                    operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_9b8.second._M_manager);
                  }
                  if (iVar13 == 0) {
                    libcellml::VariablePair::variable1();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9b8,"\"variable1\"",
                               "testPair->variable1()->name()",(char (*) [10])"variable1",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_8f8);
                    if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                      operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_810.second._M_manager);
                    }
                    if ((undefined1)local_9b8.first == COMPONENT) {
                      testing::Message::Message((Message *)local_8f8);
                      pcVar18 = "";
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_9b8.second._M_manager !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        pcVar18 = *(char **)local_9b8.second._M_manager;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_810,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x746,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_810,(Message *)local_8f8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                      if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                          (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                         ((long *)local_8f8._0_8_ != (long *)0x0)) {
                        (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9b8.second,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    libcellml::VariablePair::variable2();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9b8,"\"variable1\"",
                               "testPair->variable2()->name()",(char (*) [10])"variable1",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_8f8);
                    if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                      operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_810.second._M_manager);
                    }
                    if ((undefined1)local_9b8.first == COMPONENT) {
                      testing::Message::Message((Message *)local_8f8);
                      pcVar18 = "";
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_9b8.second._M_manager !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        pcVar18 = *(char **)local_9b8.second._M_manager;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_810,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x747,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_810,(Message *)local_8f8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                      if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                          (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                         ((long *)local_8f8._0_8_ != (long *)0x0)) {
                        (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9b8.second,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    libcellml::VariablePair::variable1();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9b8,"\"variable2\"",
                               "testPair->variable1()->name()",(char (*) [10])"variable2",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_8f8);
                    if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                      operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_810.second._M_manager);
                    }
                    if ((undefined1)local_9b8.first == COMPONENT) {
                      testing::Message::Message((Message *)local_8f8);
                      pcVar18 = "";
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_9b8.second._M_manager !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        pcVar18 = *(char **)local_9b8.second._M_manager;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_810,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x749,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_810,(Message *)local_8f8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                      if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                          (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                         ((long *)local_8f8._0_8_ != (long *)0x0)) {
                        (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9b8.second,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    libcellml::VariablePair::variable2();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9b8,"\"variable2\"",
                               "testPair->variable2()->name()",(char (*) [10])"variable2",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_8f8);
                    if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
                      operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_810.second._M_manager);
                    }
                    if ((undefined1)local_9b8.first == COMPONENT) {
                      testing::Message::Message((Message *)local_8f8);
                      pcVar18 = "";
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_9b8.second._M_manager !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        pcVar18 = *(char **)local_9b8.second._M_manager;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_810,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x74a,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_810,(Message *)local_8f8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
                      if ((((long *)local_8f8._0_8_ != (long *)0x0) &&
                          (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                         ((long *)local_8f8._0_8_ != (long *)0x0)) {
                        (**(code **)(*(long *)local_8f8._0_8_ + 8))();
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9b8.second,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                }
              }
            }
            break;
          case 7:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9b8,
                       (shared_ptr<libcellml::Model> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x74f,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 8:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9b8,
                       (shared_ptr<libcellml::Reset> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x752,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 9:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9b8,
                       (shared_ptr<libcellml::Reset> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x755,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 10:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9b8,
                       (shared_ptr<libcellml::Reset> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x758,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xc:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            pvVar15 = std::__any_caster<std::shared_ptr<libcellml::UnitsItem>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (pvVar15 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar15 + 8);
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(p_Var5 + 8) = *(int *)(p_Var5 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(p_Var5 + 8) = *(int *)(p_Var5 + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::unitsItem();
            libcellml::UnitsItem::units();
            libcellml::UnitsItem::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)&local_9b8,"ue->units()","ua->units()",
                       (shared_ptr<libcellml::Units> *)&local_810,&local_768);
            if (local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((undefined1)local_9b8.first == COMPONENT) {
              testing::Message::Message((Message *)&local_810);
              pcVar18 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar18 = *(char **)local_9b8.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_768,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x75d,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_768,(Message *)&local_810);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_768);
              if ((((long *)local_810._0_8_ != (long *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((long *)local_810._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_810._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9b8.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_810._0_8_ = libcellml::UnitsItem::index();
            local_768.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)libcellml::UnitsItem::index();
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&local_9b8,"ue->index()","ua->index()",
                       (unsigned_long *)&local_810,(unsigned_long *)&local_768);
            if ((undefined1)local_9b8.first == COMPONENT) {
              testing::Message::Message((Message *)&local_810);
              pcVar18 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar18 = *(char **)local_9b8.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_768,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x75e,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_768,(Message *)&local_810);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_768);
              if ((((long *)local_810._0_8_ != (long *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((long *)local_810._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_810._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9b8.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8f8._8_8_);
            }
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            break;
          case 0xd:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Units>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second)",
                       "item->units()",(shared_ptr<libcellml::Units> *)&local_9b8,
                       (shared_ptr<libcellml::Units> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x762,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xe:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_510,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Variable>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b8._0_8_ = *puVar16;
            local_9b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b8.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::variable();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
                      ((internal *)local_8f8,
                       "std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second)",
                       "item->variable()",(shared_ptr<libcellml::Variable> *)&local_9b8,
                       (shared_ptr<libcellml::Variable> *)&local_810);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_810.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8.second._M_manager
                        );
            }
            if (local_8f8[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9b8);
              pcVar18 = "";
              if ((pointer)local_8f8._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_8f8._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x765,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_810,(Message *)&local_9b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_810);
              if ((((_Storage *)local_9b8._0_8_ != (_Storage *)0x0) &&
                  (cVar11 = testing::internal::IsTrue(true), cVar11 != '\0')) &&
                 ((_Storage *)local_9b8._0_8_ != (_Storage *)0x0)) {
                (**(code **)((long)*(void **)local_9b8._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_8f8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          p_Var19 = p_Var19 + 0x10;
          lVar20 = lVar20 + 0x18;
          this_02 = this_01;
        } while (p_Var19 != p_Var10);
      }
      std::
      vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
      ::~vector((vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
                 *)&local_5d0);
      __k = __k + 1;
    } while (__k != local_2a0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.second._M_manager);
  }
  if (this_01 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::~_Rb_tree(&local_510);
  if (local_720 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_720);
  }
  if (local_5d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8);
  }
  if (local_6f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6f0);
  }
  if (local_710 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_710);
  }
  if (local_700 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_700);
  }
  if (local_9c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9c0);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}